

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precalc_lcp_common.cpp
# Opt level: O0

void DoNotOptimizeAway<lcp_experiment&>(lcp_experiment *x)

{
  bool bVar1;
  int iVar2;
  char *in_RDI;
  lcp_experiment *p;
  id local_18;
  id local_10;
  char *local_8;
  
  local_8 = in_RDI;
  if (DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid == '\0') {
    iVar2 = __cxa_guard_acquire(&DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid);
    if (iVar2 != 0) {
      DoNotOptimizeAway<lcp_experiment_&>::ttid = std::this_thread::get_id();
      __cxa_guard_release(&DoNotOptimizeAway<lcp_experiment&>(lcp_experiment&)::ttid);
    }
  }
  local_10._M_thread = DoNotOptimizeAway<lcp_experiment_&>::ttid._M_thread;
  std::thread::id::id(&local_18);
  bVar1 = std::operator==(local_10,local_18);
  if (!bVar1) {
    return;
  }
  putchar((int)*local_8);
  abort();
}

Assistant:

void DoNotOptimizeAway(T&& x) { // copied from https://github.com/DigitalInBlue/Celero/
  static auto ttid = std::this_thread::get_id();
  if(ttid == std::thread::id()) {
    const auto* p = &x;
    putchar(*reinterpret_cast<const char*>(p));
    std::abort();
  }
}